

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetSubpassRenderTargets
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  uint uVar1;
  Uint32 UVar2;
  FramebufferVkImpl *pFVar3;
  RenderPassVkImpl *this_00;
  AttachmentReference *pAVar4;
  ShadingRateAttachment *pSVar5;
  bool bVar6;
  int iVar7;
  SubpassDesc *pSVar8;
  undefined4 extraout_var;
  long lVar9;
  ITextureView *pIVar10;
  undefined4 extraout_var_00;
  char (*in_RCX) [68];
  string *Args_1;
  ShadingRateAttachment *SRAttachmentRef;
  ulong uVar11;
  string msg_2;
  ITextureView *ppRTVs [8];
  undefined1 local_a0 [32];
  RESOURCE_STATE_TRANSITION_MODE local_80;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((this->m_pBoundFramebuffer).m_pObject == (FramebufferVkImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&local_78,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pBoundFramebuffer",(char (*) [20])in_RCX);
    in_RCX = (char (*) [68])0x4ba;
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"SetSubpassRenderTargets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x4ba);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_pActiveRenderPass).m_pObject == (RenderPassVkImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&local_78,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pActiveRenderPass",(char (*) [20])in_RCX);
    in_RCX = (char (*) [68])0x4bb;
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"SetSubpassRenderTargets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x4bb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  pFVar3 = (this->m_pBoundFramebuffer).m_pObject;
  this_00 = (this->m_pActiveRenderPass).m_pObject;
  pSVar8 = RenderPassBase<Diligent::EngineVkImplTraits>::GetSubpass
                     (&this_00->super_RenderPassBase<Diligent::EngineVkImplTraits>,
                      this->m_SubpassIndex);
  this->m_FramebufferSamples = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 0;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  if (pSVar8->RenderTargetAttachmentCount != 0) {
    uVar11 = 0;
    do {
      pAVar4 = pSVar8->pRenderTargetAttachments;
      uVar1 = pAVar4[uVar11].AttachmentIndex;
      if (uVar1 != 0xffffffff) {
        if ((this_00->super_RenderPassBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
            .m_Desc.AttachmentCount <= uVar1) {
          FormatString<char[26],char[57]>
                    ((string *)local_a0,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                     (char (*) [57])in_RCX);
          DebugAssertionFailed
                    ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"SetSubpassRenderTargets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                     ,0x4cb);
          if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_),
                            local_a0._16_8_ + 1);
          }
        }
        in_RCX = (char (*) [68])(ulong)pAVar4[uVar11].AttachmentIndex;
        pIVar10 = (pFVar3->super_FramebufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                  .m_Desc.ppAttachments[(long)in_RCX];
        (&local_78._M_dataplus)[uVar11]._M_p = (pointer)pIVar10;
        if (pIVar10 != (ITextureView *)0x0) {
          UVar2 = this->m_FramebufferSamples;
          iVar7 = (*(pIVar10->super_IDeviceObject).super_IObject._vptr_IObject[10])();
          in_RCX = *(char (**) [68])CONCAT44(extraout_var,iVar7);
          lVar9 = (**(code **)(*in_RCX + 0x20))((long *)CONCAT44(extraout_var,iVar7));
          if (UVar2 == 0) {
            this->m_FramebufferSamples = *(Uint32 *)(lVar9 + 0x20);
          }
          else if (UVar2 != *(Uint32 *)(lVar9 + 0x20)) {
            FormatString<char[26]>((string *)local_a0,(char (*) [26])"Inconsistent sample count");
            in_RCX = (char (*) [68])0x4d2;
            DebugAssertionFailed
                      ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"SetSubpassRenderTargets",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                       ,0x4d2);
            if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
              operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_),
                              local_a0._16_8_ + 1);
            }
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < pSVar8->RenderTargetAttachmentCount);
  }
  pAVar4 = pSVar8->pDepthStencilAttachment;
  if ((pAVar4 != (AttachmentReference *)0x0) && (pAVar4->AttachmentIndex != 0xffffffff)) {
    if ((this_00->super_RenderPassBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
        .m_Desc.AttachmentCount <= pAVar4->AttachmentIndex) {
      FormatString<char[26],char[57]>
                ((string *)local_a0,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                 (char (*) [57])in_RCX);
      in_RCX = (char (*) [68])0x4dc;
      DebugAssertionFailed
                ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"SetSubpassRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x4dc);
      if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_),local_a0._16_8_ + 1);
      }
    }
    if (pAVar4->State == RESOURCE_STATE_DEPTH_READ) {
      pIVar10 = FramebufferBase<Diligent::EngineVkImplTraits>::GetReadOnlyDSV
                          (&((this->m_pBoundFramebuffer).m_pObject)->
                            super_FramebufferBase<Diligent::EngineVkImplTraits>,this->m_SubpassIndex
                          );
    }
    else {
      in_RCX = (char (*) [68])(ulong)pAVar4->AttachmentIndex;
      pIVar10 = (pFVar3->super_FramebufferBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                .m_Desc.ppAttachments[(long)in_RCX];
    }
    if (pIVar10 != (ITextureView *)0x0) {
      UVar2 = this->m_FramebufferSamples;
      iVar7 = (*(pIVar10->super_IDeviceObject).super_IObject._vptr_IObject[10])(pIVar10);
      in_RCX = *(char (**) [68])CONCAT44(extraout_var_00,iVar7);
      lVar9 = (**(code **)(*in_RCX + 0x20))((long *)CONCAT44(extraout_var_00,iVar7));
      if (UVar2 == 0) {
        this->m_FramebufferSamples = *(Uint32 *)(lVar9 + 0x20);
      }
      else if (UVar2 != *(Uint32 *)(lVar9 + 0x20)) {
        FormatString<char[26]>((string *)local_a0,(char (*) [26])"Inconsistent sample count");
        in_RCX = (char (*) [68])0x4e5;
        DebugAssertionFailed
                  ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"SetSubpassRenderTargets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x4e5);
        if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_),local_a0._16_8_ + 1)
          ;
        }
      }
      goto LAB_002b549d;
    }
  }
  pIVar10 = (ITextureView *)0x0;
LAB_002b549d:
  pSVar5 = pSVar8->pShadingRateAttachment;
  if ((pSVar5 == (ShadingRateAttachment *)0x0) ||
     (uVar1 = (pSVar5->Attachment).AttachmentIndex, uVar1 == 0xffffffff)) {
    local_a0._24_8_ = (ITextureView *)0x0;
  }
  else {
    if ((this_00->super_RenderPassBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
        .m_Desc.AttachmentCount <= uVar1) {
      FormatString<char[26],char[68]>
                ((string *)local_a0,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "SRAttachmentRef.Attachment.AttachmentIndex < RPDesc.AttachmentCount",in_RCX);
      DebugAssertionFailed
                ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"SetSubpassRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x4ef);
      if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_),local_a0._16_8_ + 1);
      }
    }
    local_a0._24_8_ =
         (pFVar3->super_FramebufferBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
         .m_Desc.ppAttachments[(pSVar5->Attachment).AttachmentIndex];
  }
  local_a0._0_4_ = pSVar8->RenderTargetAttachmentCount;
  Args_1 = &local_78;
  local_80 = RESOURCE_STATE_TRANSITION_MODE_NONE;
  local_a0._8_8_ = Args_1;
  local_a0._16_8_ = pIVar10;
  bVar6 = SetRenderTargets(this,(SetRenderTargetsAttribs *)local_a0);
  this->m_FramebufferWidth =
       (pFVar3->super_FramebufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
       .m_Desc.Width;
  this->m_FramebufferHeight =
       (pFVar3->super_FramebufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
       .m_Desc.Height;
  this->m_FramebufferSlices =
       (pFVar3->super_FramebufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
       .m_Desc.NumArraySlices;
  if ((this->m_FramebufferSamples == 0) &&
     ((pSVar8->RenderTargetAttachmentCount != 0 ||
      (pSVar8->pDepthStencilAttachment != (AttachmentReference *)0x0)))) {
    FormatString<char[26],char[119]>
              ((string *)local_a0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "(m_FramebufferSamples > 0) || (Subpass.RenderTargetAttachmentCount == 0 && Subpass.pDepthStencilAttachment == nullptr)"
               ,(char (*) [119])Args_1);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"SetSubpassRenderTargets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x4fa);
    if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_),
                      (ulong)(local_a0._16_8_ + 1));
    }
  }
  return bVar6;
}

Assistant:

inline bool DeviceContextBase<ImplementationTraits>::SetSubpassRenderTargets()
{
    VERIFY_EXPR(m_pBoundFramebuffer);
    VERIFY_EXPR(m_pActiveRenderPass);

    const RenderPassDesc&  RPDesc  = m_pActiveRenderPass->GetDesc();
    const FramebufferDesc& FBDesc  = m_pBoundFramebuffer->GetDesc();
    const SubpassDesc&     Subpass = m_pActiveRenderPass->GetSubpass(m_SubpassIndex);

    m_FramebufferSamples = 0;

    ITextureView* ppRTVs[MAX_RENDER_TARGETS] = {};
    ITextureView* pDSV                       = nullptr;
    ITextureView* pSRM                       = nullptr;
    for (Uint32 rt = 0; rt < Subpass.RenderTargetAttachmentCount; ++rt)
    {
        const AttachmentReference& RTAttachmentRef = Subpass.pRenderTargetAttachments[rt];
        if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
        {
            VERIFY_EXPR(RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
            ppRTVs[rt] = FBDesc.ppAttachments[RTAttachmentRef.AttachmentIndex];
            if (ppRTVs[rt] != nullptr)
            {
                if (m_FramebufferSamples == 0)
                    m_FramebufferSamples = ppRTVs[rt]->GetTexture()->GetDesc().SampleCount;
                else
                    DEV_CHECK_ERR(m_FramebufferSamples == ppRTVs[rt]->GetTexture()->GetDesc().SampleCount, "Inconsistent sample count");
            }
        }
    }

    if (Subpass.pDepthStencilAttachment != nullptr)
    {
        const AttachmentReference& DSAttachmentRef = *Subpass.pDepthStencilAttachment;
        if (DSAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
        {
            VERIFY_EXPR(DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
            pDSV = DSAttachmentRef.State == RESOURCE_STATE_DEPTH_READ ?
                m_pBoundFramebuffer->GetReadOnlyDSV(m_SubpassIndex) :
                FBDesc.ppAttachments[DSAttachmentRef.AttachmentIndex];
            if (pDSV != nullptr)
            {
                if (m_FramebufferSamples == 0)
                    m_FramebufferSamples = pDSV->GetTexture()->GetDesc().SampleCount;
                else
                    DEV_CHECK_ERR(m_FramebufferSamples == pDSV->GetTexture()->GetDesc().SampleCount, "Inconsistent sample count");
            }
        }
    }

    if (Subpass.pShadingRateAttachment != nullptr)
    {
        const ShadingRateAttachment& SRAttachmentRef = *Subpass.pShadingRateAttachment;
        if (SRAttachmentRef.Attachment.AttachmentIndex != ATTACHMENT_UNUSED)
        {
            VERIFY_EXPR(SRAttachmentRef.Attachment.AttachmentIndex < RPDesc.AttachmentCount);
            pSRM = FBDesc.ppAttachments[SRAttachmentRef.Attachment.AttachmentIndex];
        }
    }

    bool BindRenderTargets = SetRenderTargets({Subpass.RenderTargetAttachmentCount, ppRTVs, pDSV, RESOURCE_STATE_TRANSITION_MODE_NONE, pSRM});

    // Use framebuffer dimensions (override what was set by SetRenderTargets)
    m_FramebufferWidth  = FBDesc.Width;
    m_FramebufferHeight = FBDesc.Height;
    m_FramebufferSlices = FBDesc.NumArraySlices;
    VERIFY_EXPR((m_FramebufferSamples > 0) || (Subpass.RenderTargetAttachmentCount == 0 && Subpass.pDepthStencilAttachment == nullptr));

    return BindRenderTargets;
}